

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

int add_user_callback(void *data,int nr_cols,char **field,char **colName)

{
  uint uVar1;
  char **ppcVar2;
  uint *puVar3;
  long lVar4;
  ostream *poVar5;
  undefined8 uVar6;
  int id;
  string bio;
  string username;
  string alias;
  string password;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  vector<User,_std::allocator<User>_> *local_1a0;
  char **local_198;
  long local_190;
  char *local_188 [2];
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  User local_b8;
  
  local_1a0 = (vector<User,_std::allocator<User>_> *)data;
  std::__cxx11::string::string((string *)&local_b8,*field,(allocator *)&local_178);
  uVar6 = local_b8._0_8_;
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  *puVar3 = 0;
  lVar4 = strtol((char *)uVar6,(char **)&local_198,10);
  if (local_198 == (char **)uVar6) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    id = (int)lVar4;
    if ((id == lVar4) && (*puVar3 != 0x22)) {
      if (*puVar3 == 0) {
        *puVar3 = uVar1;
      }
      ppcVar2 = (char **)((long)&local_b8 + 0x10);
      if ((char **)local_b8._0_8_ != ppcVar2) {
        operator_delete((void *)local_b8._0_8_);
      }
      std::__cxx11::string::string((string *)&local_198,field[1],(allocator *)&local_b8);
      local_170 = 0;
      local_168[0] = 0;
      local_178 = local_168;
      if (field[2] != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_b8,field[2],(allocator *)&local_1c0);
        std::__cxx11::string::operator=((string *)&local_178,(string *)&local_b8);
        if ((char **)local_b8._0_8_ != ppcVar2) {
          operator_delete((void *)local_b8._0_8_);
        }
      }
      local_1c0 = local_1b0;
      local_1b8 = 0;
      local_1b0[0] = 0;
      if (field[3] != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_b8,field[3],(allocator *)&local_158);
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_b8);
        if ((char **)local_b8._0_8_ != ppcVar2) {
          operator_delete((void *)local_b8._0_8_);
        }
      }
      std::__cxx11::string::string((string *)&local_158,field[4],(allocator *)&local_b8);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_198,(long)local_198 + local_190);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_178,local_178 + local_170)
      ;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_1c0,local_1c0 + local_1b8);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_158,local_158 + local_150);
      User::User(&local_b8,id,&local_d8,&local_f8,&local_118,&local_138);
      std::vector<User,_std::allocator<User>_>::emplace_back<User>(local_1a0,&local_b8);
      if (local_b8.password._M_dataplus._M_p != (pointer)((long)&local_b8 + 0x78U)) {
        operator_delete(local_b8.password._M_dataplus._M_p);
      }
      if (local_b8.bio._M_dataplus._M_p != (pointer)((long)&local_b8 + 0x58)) {
        operator_delete(local_b8.bio._M_dataplus._M_p);
      }
      if (local_b8.alias._M_dataplus._M_p != (pointer)((long)&local_b8 + 0x38)) {
        operator_delete(local_b8.alias._M_dataplus._M_p);
      }
      if (local_b8.username._M_dataplus._M_p != (pointer)((long)&local_b8 + 0x18)) {
        operator_delete(local_b8.username._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,id);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_198,local_190);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_158 != local_148) {
        operator_delete(local_158);
      }
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0);
      }
      if (local_178 != local_168) {
        operator_delete(local_178);
      }
      if (local_198 != local_188) {
        operator_delete(local_198);
      }
      return 0;
    }
  }
  uVar6 = std::__throw_out_of_range("stoi");
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_178 != (undefined1 *)(ulong)uVar1) {
    operator_delete(local_178);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  __cxa_begin_catch(uVar6);
  __cxa_end_catch();
  return 1;
}

Assistant:

static int add_user_callback(void *data, int nr_cols, char **field, char **colName)
{
	std::vector<User>* result = static_cast<std::vector<User>*>(data);

	try
	{
		int id = std::stoi(field[0]);
		std::string username(field[1]);
		std::string alias;
		if(field[2] != nullptr)
			alias = std::string(field[2]);
		std::string bio;
		if(field[3] != nullptr)
			bio = std::string(field[3]);
		std::string password(field[4]);

		result->push_back(User(id, username, alias, bio, password));
		std::cout << id << " " << username << std::endl;
	}
	catch (...)
	{
		return 1;
	}

	return 0;
}